

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

iterator __thiscall
cs::tree_type<cs::token_base*>::emplace_right_left<cs::token_base*&>
          (tree_type<cs::token_base*> *this,iterator it,token_base **args)

{
  tree_node *ptVar1;
  iterator iVar2;
  error *this_00;
  allocator local_31;
  string local_30;
  
  if (it.mData != (tree_node *)0x0) {
    iVar2.mData = (tree_node *)operator_new(0x20);
    ptVar1 = (it.mData)->right;
    (iVar2.mData)->root = it.mData;
    (iVar2.mData)->left = ptVar1;
    (iVar2.mData)->right = (tree_node *)0x0;
    (iVar2.mData)->data = *args;
    if (ptVar1 != (tree_node *)0x0) {
      ptVar1->root = iVar2.mData;
    }
    (it.mData)->right = iVar2.mData;
    return (iterator)iVar2.mData;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000E",&local_31);
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool usable() const noexcept
			{
				return this->mData != nullptr;
			}